

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTables.h
# Opt level: O2

void __thiscall CTables::calcOrientationTable(CTables *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int **ppiVar5;
  double **ppdVar6;
  int *piVar7;
  double *pdVar8;
  ostream *poVar9;
  CTables *this_00;
  int x;
  int iVar10;
  long lVar11;
  int y;
  int iVar12;
  long lVar13;
  double dVar14;
  
  ppiVar5 = (int **)operator_new__(0xff8);
  this->orientationFullTable = ppiVar5;
  ppiVar5 = (int **)operator_new__(0xff8);
  this->orientationHalfTable = ppiVar5;
  ppdVar6 = (double **)operator_new__(0xff8);
  this->magnitudeTable = ppdVar6;
  iVar1 = this->oriFull;
  iVar2 = this->oriHalf;
  iVar3 = this->numOriFull;
  iVar4 = this->numOriHalf;
  for (lVar13 = -0xff; lVar13 != 0x100; lVar13 = lVar13 + 1) {
    piVar7 = (int *)operator_new__(0x7fc);
    this->orientationFullTable[lVar13 + 0xff] = piVar7;
    piVar7 = (int *)operator_new__(0x7fc);
    this->orientationHalfTable[lVar13 + 0xff] = piVar7;
    this_00 = (CTables *)0xff8;
    pdVar8 = (double *)operator_new__(0xff8);
    iVar12 = (int)lVar13;
    this->magnitudeTable[lVar13 + 0xff] = pdVar8;
    for (lVar11 = -0xff; lVar11 != 0x100; lVar11 = lVar11 + 1) {
      iVar10 = (int)lVar11;
      dVar14 = arcTan(this_00,(double)iVar10,(double)iVar12);
      this->orientationFullTable[lVar13 + 0xff][lVar11 + 0xff] =
           (int)((double)(((int)dVar14 + 0x168) % this->oriFull) / (double)(iVar1 / iVar3));
      dVar14 = arcTan(this_00,(double)iVar10,(double)iVar12);
      this->orientationHalfTable[lVar13 + 0xff][lVar11 + 0xff] =
           (int)((double)(((int)dVar14 + 0x168) % this->oriHalf) / (double)(iVar2 / iVar4));
      this->magnitudeTable[lVar13 + 0xff][lVar11 + 0xff] =
           (double)SQRT((float)(iVar10 * iVar10 + iVar12 * iVar12));
    }
  }
  poVar9 = std::operator<<((ostream *)&std::cout,"ori and magn table created");
  std::endl<char,std::char_traits<char>>(poVar9);
  return;
}

Assistant:

void CTables::calcOrientationTable()
{
    orientationFullTable = new int*[NUM_DIFF];
    orientationHalfTable = new int*[NUM_DIFF];
    magnitudeTable = new double*[NUM_DIFF];
    double intervalFull = oriFull/numOriFull;
    double intervalHalf = oriHalf/numOriHalf;
    for(int y=-255; y<=255; y++)
    {
        orientationFullTable[y+255] = new int[NUM_DIFF];
        orientationHalfTable[y+255] = new int[NUM_DIFF];
        magnitudeTable[y+255] = new double[NUM_DIFF];
        for(int x=-255; x<=255; x++)
        {
            orientationFullTable[y+255][x+255] = (((int)arcTan(x, y)+360)%oriFull)/intervalFull;
            orientationHalfTable[y+255][x+255] = (((int)arcTan(x, y)+360)%oriHalf)/intervalHalf;
            magnitudeTable[y+255][x+255] = sqrtf(x*x + y*y);
        }
    }
    cout<<"ori and magn table created"<<endl;
}